

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O0

void __thiscall crnlib::qdxt1::cluster_id::set(cluster_id *this,vector<unsigned_int> *indices)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  uint *puVar4;
  vector<unsigned_int> *in_RSI;
  vector<unsigned_int> *in_RDI;
  uint i;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_14;
  
  vector<unsigned_int>::size(in_RSI);
  vector<unsigned_int>::resize
            (in_RDI,in_stack_ffffffffffffffdc,SUB41(in_stack_ffffffffffffffd8 >> 0x18,0));
  local_14 = 0;
  while( true ) {
    uVar2 = local_14;
    uVar1 = vector<unsigned_int>::size(in_RSI);
    if (uVar1 <= uVar2) break;
    puVar4 = vector<unsigned_int>::operator[](in_RSI,local_14);
    in_stack_ffffffffffffffd8 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](in_RDI,local_14);
    *puVar4 = in_stack_ffffffffffffffd8;
    local_14 = local_14 + 1;
  }
  vector<unsigned_int>::begin(in_RDI);
  vector<unsigned_int>::end(in_RDI);
  std::sort<unsigned_int*>((uint *)in_RDI,(uint *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  puVar4 = vector<unsigned_int>::operator[](in_RDI,0);
  uVar2 = vector<unsigned_int>::size(in_RDI);
  uVar3 = fast_hash(puVar4,uVar2 << 2);
  in_RDI[1].m_p = (uint *)(ulong)uVar3;
  return;
}

Assistant:

void set(const crnlib::vector<uint>& indices) {
      m_cells.resize(indices.size());

      for (uint i = 0; i < indices.size(); i++)
        m_cells[i] = static_cast<uint32>(indices[i]);

      std::sort(m_cells.begin(), m_cells.end());

      m_hash = fast_hash(&m_cells[0], sizeof(m_cells[0]) * m_cells.size());
    }